

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferSource.hpp
# Opt level: O0

void __thiscall
Outputs::Speaker::SampleSource<GI::AY38910::AY38910<true>,_true,_4>::
apply_samples<(Outputs::Speaker::Action)0>
          (SampleSource<GI::AY38910::AY38910<true>,_true,_4> *this,size_t number_of_samples,
          type *target)

{
  StereoSample *pSVar1;
  long lVar2;
  bool bVar3;
  undefined1 local_48 [8];
  undefined1 local_40 [12];
  int whole_steps;
  ulong uStack_30;
  type level;
  size_t c;
  AY38910<true> *source;
  type *target_local;
  size_t number_of_samples_local;
  SampleSource<GI::AY38910::AY38910<true>,_true,_4> *this_local;
  
  uStack_30 = 0;
  GI::AY38910::AY38910SampleSource<true>::level((AY38910SampleSource<true> *)&whole_steps);
  while( true ) {
    bVar3 = false;
    if (uStack_30 < number_of_samples) {
      bVar3 = this->master_divider_ != 4;
    }
    if (!bVar3) break;
    pSVar1 = target + uStack_30;
    StereoSample::StereoSample((StereoSample *)(local_40 + 8),(StereoSample *)&whole_steps);
    apply<(Outputs::Speaker::Action)0,Outputs::Speaker::StereoSample>
              (pSVar1,(StereoSample *)(local_40 + 8));
    uStack_30 = uStack_30 + 1;
    this->master_divider_ = this->master_divider_ + 1;
  }
  GI::AY38910::AY38910SampleSource<true>::advance((AY38910SampleSource<true> *)(this + -0x454));
  local_40._4_4_ = (undefined4)(number_of_samples - uStack_30 >> 2);
  while (local_40._4_4_ != 0) {
    pSVar1 = target + uStack_30;
    lVar2 = uStack_30 + 4;
    local_40._4_4_ = local_40._4_4_ + -1;
    GI::AY38910::AY38910SampleSource<true>::level((AY38910SampleSource<true> *)local_40);
    fill<(Outputs::Speaker::Action)0,Outputs::Speaker::StereoSample*,Outputs::Speaker::StereoSample>
              (pSVar1,target + lVar2,(StereoSample *)local_40);
    uStack_30 = uStack_30 + 4;
    GI::AY38910::AY38910SampleSource<true>::advance((AY38910SampleSource<true> *)(this + -0x454));
  }
  local_40._4_4_ = local_40._4_4_ + -1;
  GI::AY38910::AY38910SampleSource<true>::level((AY38910SampleSource<true> *)(local_48 + 4));
  whole_steps = local_48._4_4_;
  this->master_divider_ = (int)number_of_samples - (int)uStack_30;
  pSVar1 = target + uStack_30;
  GI::AY38910::AY38910SampleSource<true>::level((AY38910SampleSource<true> *)local_48);
  fill<(Outputs::Speaker::Action)0,Outputs::Speaker::StereoSample*,Outputs::Speaker::StereoSample>
            (pSVar1,target + number_of_samples,(StereoSample *)local_48);
  return;
}

Assistant:

void apply_samples(std::size_t number_of_samples, typename SampleT<stereo>::type *target) {
			auto &source = *static_cast<SourceT *>(this);

			if constexpr (divider == 1) {
				while(number_of_samples--) {
					apply<action>(*target, source.level());
					++target;
					source.advance();
				}
			} else {
				std::size_t c = 0;

				// Fill in the tail of any partially-captured level.
				auto level = source.level();
				while(c < number_of_samples && master_divider_ != divider) {
					apply<action>(target[c], level);
					++c;
					++master_divider_;
				}
				source.advance();

				// Provide all full levels.
				auto whole_steps = static_cast<int>((number_of_samples - c) / divider);
				while(whole_steps--) {
					fill<action>(&target[c], &target[c + divider], source.level());
					c += divider;
					source.advance();
				}

				// Provide the head of a further partial capture.
				level = source.level();
				master_divider_ = static_cast<int>(number_of_samples - c);
				fill<action>(&target[c], &target[number_of_samples], source.level());
			}
		}